

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O1

bool __thiscall pbrt::syntactic::ParamSet::hasParam3f(ParamSet *this,string *name)

{
  bool bVar1;
  long local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  _Base_ptr local_28;
  _Base_ptr local_20;
  
  findParam<float>((ParamSet *)&local_28,(string *)this);
  if (local_28 == (_Base_ptr)0x0) {
    bVar1 = false;
  }
  else {
    findParam<float>((ParamSet *)&local_38,(string *)this);
    bVar1 = *(long *)(local_38 + 0x20) - *(long *)(local_38 + 0x18) == 0xc;
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
  }
  if (local_20 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
  }
  return bVar1;
}

Assistant:

bool hasParam3f(const std::string &name) const {
        return (bool)findParam<float>(name) && findParam<float>(name)->size() == 3;
      }